

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cc
# Opt level: O0

void __thiscall tt::LogFile::append_unlocked(LogFile *this,char *logline,int len)

{
  pointer pAVar1;
  int len_local;
  char *logline_local;
  LogFile *this_local;
  
  pAVar1 = std::unique_ptr<tt::FileUtil::AppendFile,_std::default_delete<tt::FileUtil::AppendFile>_>
           ::operator->(&this->m_file);
  FileUtil::AppendFile::append(pAVar1,logline,(long)len);
  this->m_count = this->m_count + 1;
  if (this->m_flushEveryN <= this->m_count) {
    this->m_count = 0;
    pAVar1 = std::
             unique_ptr<tt::FileUtil::AppendFile,_std::default_delete<tt::FileUtil::AppendFile>_>::
             operator->(&this->m_file);
    FileUtil::AppendFile::flush(pAVar1);
  }
  return;
}

Assistant:

void tt::LogFile::append_unlocked(const char* logline, int len){
	m_file->append(logline, len);

	++m_count;
	if(m_count >= m_flushEveryN){
		m_count = 0;
		m_file->flush();
	}
}